

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRConsoleNode.cpp
# Opt level: O2

void __thiscall
MinVR::VRConsoleNode::render
          (VRConsoleNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  VRDataIndex::pushState(renderState);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"/IsConsole",&local_59);
  VRDataIndex::addData(&local_38,renderState,&local_58,1);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  (*renderHandler->_vptr_VRRenderHandler[1])(renderHandler,renderState);
  (**renderHandler->_vptr_VRRenderHandler)(renderHandler,renderState);
  VRDataIndex::popState(renderState);
  return;
}

Assistant:

void VRConsoleNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler) {

  renderState->pushState();
	renderState->addData("/IsConsole", 1);

	renderHandler->onVRRenderContext(*renderState);
	renderHandler->onVRRenderScene(*renderState);

   renderState->popState();
}